

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

double __thiscall nonius::html_reporter::ideal_magnitude(html_reporter *this)

{
  bool bVar1;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
  this_00;
  reference pdVar2;
  size_type in_RDI;
  vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_> *this_01;
  double dVar3;
  duration<double,_std::ratio<1L,_1L>_> min;
  value_type d;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
  *__range3;
  run_t *r;
  const_iterator __end2;
  const_iterator __begin2;
  vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_> *__range2;
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  mins;
  fp_seconds in_stack_fffffffffffffe58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
  *in_stack_fffffffffffffe60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
  *in_stack_fffffffffffffe68;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
  in_stack_fffffffffffffe70;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
  in_stack_fffffffffffffe78;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
  local_140;
  rep local_138;
  duration<double,_std::ratio<1L,_1L>_> *local_130;
  duration<double,_std::ratio<1L,_1L>_> *local_128;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
  local_120 [5];
  duration<double,_std::ratio<1L,_1L>_> local_f8 [18];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_true>
  local_68;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_true>
  local_60;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
  *local_58;
  reference local_50;
  run_t *local_48;
  __normal_iterator<const_nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
  local_40;
  long local_38;
  
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
            *)0x1fd54e);
  this_01 = (vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_> *)
            (in_RDI + 0x78);
  std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>::size
            (this_01);
  std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>::front
            ((vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_> *)
             in_stack_fffffffffffffe60);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
  ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
          *)0x1fd57c);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
             *)this_01,in_RDI);
  local_38 = in_RDI + 0x78;
  local_40._M_current =
       (run_t *)std::
                vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                ::begin((vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                         *)in_stack_fffffffffffffe58.__r);
  local_48 = (run_t *)std::
                      vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                      ::end((vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                             *)in_stack_fffffffffffffe58.__r);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<const_nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
                        *)in_stack_fffffffffffffe58.__r);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
               ::operator*(&local_40);
    local_58 = &local_50->data;
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
                  *)in_stack_fffffffffffffe58.__r);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
                *)in_stack_fffffffffffffe58.__r);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_false,_true>
      ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_false,_true>
                   *)0x1fd668);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
              *)in_stack_fffffffffffffe70._M_current,in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe78._M_current = local_f8;
      local_128 = (duration<double,_std::ratio<1L,_1L>_> *)
                  std::
                  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                  ::begin((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                           *)in_stack_fffffffffffffe58.__r);
      local_130 = (duration<double,_std::ratio<1L,_1L>_> *)
                  std::
                  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                  ::end((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                         *)in_stack_fffffffffffffe58.__r);
      local_120[0] = std::
                     min_element<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>>>
                               (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      __gnu_cxx::
      __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
      ::operator*(local_120);
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
      ::push_back((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                   *)in_stack_fffffffffffffe70._M_current,(value_type *)in_stack_fffffffffffffe68);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
      ::~pair(in_stack_fffffffffffffe60);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_false,_true>
                    *)in_stack_fffffffffffffe60);
    }
    __gnu_cxx::
    __normal_iterator<const_nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
    ::operator++(&local_40);
  }
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::begin((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
           *)in_stack_fffffffffffffe58.__r);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::end((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
         *)in_stack_fffffffffffffe58.__r);
  this_00 = std::
            min_element<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>>>
                      (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  local_140 = this_00;
  pdVar2 = __gnu_cxx::
           __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
           ::operator*(&local_140);
  local_138 = pdVar2->__r;
  dVar3 = nonius::detail::get_magnitude(in_stack_fffffffffffffe58);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::~vector((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
             *)this_00._M_current);
  return dVar3;
}

Assistant:

double ideal_magnitude() const {
            std::vector<fp_seconds> mins;
            mins.reserve(runs.size() * runs.front().data.size());
            for (auto&& r : runs) {
                for(auto d : r.data) {
                    mins.push_back(*std::min_element(d.second.samples.begin(), d.second.samples.end()));
                }
            }
            auto min = *std::min_element(mins.begin(), mins.end());
            return detail::get_magnitude(min);
        }